

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_elements_pegin_contract_script_from_bytes
              (uchar *redeem_script,size_t redeem_script_len,uchar *script,size_t script_len,
              uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  ulong __n;
  uchar uVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  bool bVar3;
  size_t size_out;
  size_t ser_len;
  size_t local_1b0;
  size_t local_1a8;
  size_t opcode_size;
  secp256k1_pubkey *pub_key_combination [2];
  size_t push_size;
  secp256k1_pubkey pub_key_tweaked;
  secp256k1_pubkey pub_key;
  uchar tweak [32];
  uchar ser_pub_key [33];
  secp256k1_pubkey pub_key_from_tweak;
  secp256k1_pubkey pub_key_combined;
  
  ctx = secp_ctx();
  ser_len = 0x21;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar2 = -2;
  if ((((flags == 0) && (redeem_script != (uchar *)0x0)) && (redeem_script_len != 0)) &&
     (((script != (uchar *)0x0 && (script_len != 0)) &&
      ((bytes_out != (uchar *)0x0 && (len == redeem_script_len)))))) {
    bVar3 = false;
    local_1b0 = redeem_script_len;
    local_1a8 = script_len;
    do {
      iVar2 = script_get_push_size_from_bytes(redeem_script,redeem_script_len,&size_out);
      if (iVar2 == 0) {
        iVar2 = script_get_push_opcode_size_from_bytes(redeem_script,redeem_script_len,&opcode_size)
        ;
        if (iVar2 != 0) {
          return iVar2;
        }
        __n = opcode_size + size_out;
        if (redeem_script_len < __n) {
          return -2;
        }
        if ((size_out == 0x21 && opcode_size == 1) && !bVar3) {
          iVar2 = pubkey_parse(&pub_key,redeem_script + 1,0x21);
          if (iVar2 == 0) {
            return -1;
          }
          pub_key_tweaked.data[0x30] = pub_key.data[0x30];
          pub_key_tweaked.data[0x31] = pub_key.data[0x31];
          pub_key_tweaked.data[0x32] = pub_key.data[0x32];
          pub_key_tweaked.data[0x33] = pub_key.data[0x33];
          pub_key_tweaked.data[0x34] = pub_key.data[0x34];
          pub_key_tweaked.data[0x35] = pub_key.data[0x35];
          pub_key_tweaked.data[0x36] = pub_key.data[0x36];
          pub_key_tweaked.data[0x37] = pub_key.data[0x37];
          pub_key_tweaked.data[0x38] = pub_key.data[0x38];
          pub_key_tweaked.data[0x39] = pub_key.data[0x39];
          pub_key_tweaked.data[0x3a] = pub_key.data[0x3a];
          pub_key_tweaked.data[0x3b] = pub_key.data[0x3b];
          pub_key_tweaked.data[0x3c] = pub_key.data[0x3c];
          pub_key_tweaked.data[0x3d] = pub_key.data[0x3d];
          pub_key_tweaked.data[0x3e] = pub_key.data[0x3e];
          pub_key_tweaked.data[0x3f] = pub_key.data[0x3f];
          pub_key_tweaked.data[0x20] = pub_key.data[0x20];
          pub_key_tweaked.data[0x21] = pub_key.data[0x21];
          pub_key_tweaked.data[0x22] = pub_key.data[0x22];
          pub_key_tweaked.data[0x23] = pub_key.data[0x23];
          pub_key_tweaked.data[0x24] = pub_key.data[0x24];
          pub_key_tweaked.data[0x25] = pub_key.data[0x25];
          pub_key_tweaked.data[0x26] = pub_key.data[0x26];
          pub_key_tweaked.data[0x27] = pub_key.data[0x27];
          pub_key_tweaked.data[0x28] = pub_key.data[0x28];
          pub_key_tweaked.data[0x29] = pub_key.data[0x29];
          pub_key_tweaked.data[0x2a] = pub_key.data[0x2a];
          pub_key_tweaked.data[0x2b] = pub_key.data[0x2b];
          pub_key_tweaked.data[0x2c] = pub_key.data[0x2c];
          pub_key_tweaked.data[0x2d] = pub_key.data[0x2d];
          pub_key_tweaked.data[0x2e] = pub_key.data[0x2e];
          pub_key_tweaked.data[0x2f] = pub_key.data[0x2f];
          pub_key_tweaked.data[0x10] = pub_key.data[0x10];
          pub_key_tweaked.data[0x11] = pub_key.data[0x11];
          pub_key_tweaked.data[0x12] = pub_key.data[0x12];
          pub_key_tweaked.data[0x13] = pub_key.data[0x13];
          pub_key_tweaked.data[0x14] = pub_key.data[0x14];
          pub_key_tweaked.data[0x15] = pub_key.data[0x15];
          pub_key_tweaked.data[0x16] = pub_key.data[0x16];
          pub_key_tweaked.data[0x17] = pub_key.data[0x17];
          pub_key_tweaked.data[0x18] = pub_key.data[0x18];
          pub_key_tweaked.data[0x19] = pub_key.data[0x19];
          pub_key_tweaked.data[0x1a] = pub_key.data[0x1a];
          pub_key_tweaked.data[0x1b] = pub_key.data[0x1b];
          pub_key_tweaked.data[0x1c] = pub_key.data[0x1c];
          pub_key_tweaked.data[0x1d] = pub_key.data[0x1d];
          pub_key_tweaked.data[0x1e] = pub_key.data[0x1e];
          pub_key_tweaked.data[0x1f] = pub_key.data[0x1f];
          pub_key_tweaked.data[0] = pub_key.data[0];
          pub_key_tweaked.data[1] = pub_key.data[1];
          pub_key_tweaked.data[2] = pub_key.data[2];
          pub_key_tweaked.data[3] = pub_key.data[3];
          pub_key_tweaked.data[4] = pub_key.data[4];
          pub_key_tweaked.data[5] = pub_key.data[5];
          pub_key_tweaked.data[6] = pub_key.data[6];
          pub_key_tweaked.data[7] = pub_key.data[7];
          pub_key_tweaked.data[8] = pub_key.data[8];
          pub_key_tweaked.data[9] = pub_key.data[9];
          pub_key_tweaked.data[10] = pub_key.data[10];
          pub_key_tweaked.data[0xb] = pub_key.data[0xb];
          pub_key_tweaked.data[0xc] = pub_key.data[0xc];
          pub_key_tweaked.data[0xd] = pub_key.data[0xd];
          pub_key_tweaked.data[0xe] = pub_key.data[0xe];
          pub_key_tweaked.data[0xf] = pub_key.data[0xf];
          iVar2 = wally_hmac_sha256(redeem_script + 1,0x21,script,local_1a8,tweak,0x20);
          if (iVar2 != 0) {
            return iVar2;
          }
          iVar2 = secp256k1_ec_pubkey_tweak_add(ctx,&pub_key_tweaked,tweak);
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = pubkey_serialize(ser_pub_key,&ser_len,&pub_key_tweaked,0x102);
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = wally_script_push_from_bytes
                            (ser_pub_key,ser_len,0,bytes_out,redeem_script_len,&push_size);
          if (iVar2 != 0) {
            return iVar2;
          }
          iVar2 = secp256k1_ec_pubkey_create(ctx,&pub_key_from_tweak,tweak);
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = pubkey_negate(&pub_key);
          if (iVar2 == 0) {
            return -1;
          }
          pub_key_combination[1] = &pub_key_tweaked;
          pub_key_combination[0] = &pub_key;
          iVar2 = pubkey_combine(&pub_key_combined,pub_key_combination,2);
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = bcmp(&pub_key_combined,&pub_key_from_tweak,0x40);
          if (iVar2 != 0) {
            return -1;
          }
        }
        else {
          memcpy(bytes_out,redeem_script,__n);
        }
        redeem_script = redeem_script + __n;
        bytes_out = bytes_out + __n;
        redeem_script_len = redeem_script_len - __n;
      }
      else {
        uVar1 = *redeem_script;
        bVar3 = (bool)(bVar3 | uVar1 == 'g');
        redeem_script = redeem_script + 1;
        *bytes_out = uVar1;
        bytes_out = bytes_out + 1;
        redeem_script_len = redeem_script_len - 1;
      }
    } while (redeem_script_len != 0);
    iVar2 = 0;
    if (written != (size_t *)0x0) {
      *written = local_1b0;
    }
  }
  return iVar2;
}

Assistant:

int wally_elements_pegin_contract_script_from_bytes(const unsigned char *redeem_script,
                                                    size_t redeem_script_len,
                                                    const unsigned char *script,
                                                    size_t script_len,
                                                    uint32_t flags,
                                                    unsigned char *bytes_out,
                                                    size_t len,
                                                    size_t *written)
{
    unsigned char ser_pub_key[EC_PUBLIC_KEY_LEN];
    const secp256k1_context *ctx = secp_ctx();
    const unsigned char *p = redeem_script;
    unsigned char *q = bytes_out;
    size_t bytes_len = redeem_script_len;
    size_t ser_len = EC_PUBLIC_KEY_LEN;
    /* For liquidv1 initial watchman template, don't tweak emergency keys. in the future, use flags to change watchmen template */
    bool op_else_found = false;

    int ret;

    if (written)
        *written = 0;

    if (!redeem_script || !redeem_script_len || !script ||
        !script_len || flags || !bytes_out || len != redeem_script_len)
        return WALLY_EINVAL;

    for (;;) {
        size_t size_out;
        ret = script_get_push_size_from_bytes(p, bytes_len, &size_out);
        if (ret == WALLY_OK) {
            size_t offset_siz;
            size_t opcode_size;

            if ((ret = script_get_push_opcode_size_from_bytes(p, bytes_len, &opcode_size)) != WALLY_OK)
                return ret;

            offset_siz = size_out + opcode_size;
            if (bytes_len < offset_siz)
                return WALLY_EINVAL;

            if (opcode_size == 1 && size_out == EC_PUBLIC_KEY_LEN && !op_else_found) {
                unsigned char tweak[HMAC_SHA256_LEN];
                secp256k1_pubkey pub_key;
                secp256k1_pubkey pub_key_from_tweak;
                secp256k1_pubkey pub_key_tweaked;
                const secp256k1_pubkey *pub_key_combination[2];
                secp256k1_pubkey pub_key_combined;
                size_t push_size;

                if (!pubkey_parse(&pub_key, p + 1, EC_PUBLIC_KEY_LEN))
                    return WALLY_ERROR;
                memcpy(&pub_key_tweaked, &pub_key, sizeof(pub_key));
                if ((ret = wally_hmac_sha256(p + 1, EC_PUBLIC_KEY_LEN, script, script_len, tweak, HMAC_SHA256_LEN)) != WALLY_OK)
                    return ret;
                if (!pubkey_tweak_add(ctx, &pub_key_tweaked, tweak))
                    return WALLY_ERROR;
                if (!pubkey_serialize(ser_pub_key, &ser_len, &pub_key_tweaked, PUBKEY_COMPRESSED))
                    return WALLY_ERROR;
                if ((ret = wally_script_push_from_bytes(ser_pub_key, ser_len, 0, q, bytes_len, &push_size)) != WALLY_OK)
                    return ret;
                /* sanity checks as per elementsd */
                if (!pubkey_create(ctx, &pub_key_from_tweak, tweak))
                    return WALLY_ERROR;
                if (!pubkey_negate(&pub_key))
                    return WALLY_ERROR;

                pub_key_combination[0] = &pub_key;
                pub_key_combination[1] = &pub_key_tweaked;
                if (!pubkey_combine(&pub_key_combined, pub_key_combination, 2))
                    return WALLY_ERROR;
                if (memcmp(&pub_key_combined, &pub_key_from_tweak, sizeof(secp256k1_pubkey)) != 0)
                    return WALLY_ERROR;
            }
            else
                memcpy(q, p, offset_siz);
            p += offset_siz;
            q += offset_siz;
            bytes_len -= offset_siz;
        } else {
            if (*p == OP_ELSE && flags == 0) {
                op_else_found = true;
            }

            *q++ = *p++;
            --bytes_len;
        }
        if (bytes_len == 0)
            break;
    }

    if (written)
        *written = redeem_script_len;

    return WALLY_OK;
}